

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

int bsearch_mapped_blocks(uc_engine *uc,uint64_t address)

{
  uint32_t uVar1;
  MemoryRegion *mapping;
  uint32_t local_28;
  int mid;
  int right;
  int left;
  uint64_t address_local;
  uc_engine *uc_local;
  
  mid = 0;
  local_28 = uc->mapped_block_count;
  do {
    while( true ) {
      if ((int)local_28 <= mid) {
        return mid;
      }
      uVar1 = mid + (int)(local_28 - mid) / 2;
      if (address <= uc->mapped_blocks[(int)uVar1]->end - 1) break;
      mid = uVar1 + 1;
    }
    local_28 = uVar1;
  } while (address < uc->mapped_blocks[(int)uVar1]->addr);
  return uVar1;
}

Assistant:

static int bsearch_mapped_blocks(const uc_engine *uc, uint64_t address)
{
    int left, right, mid;
    MemoryRegion *mapping;

    left = 0;
    right = uc->mapped_block_count;

    while (left < right) {
        mid = left + (right - left) / 2;

        mapping = uc->mapped_blocks[mid];

        if (mapping->end - 1 < address) {
            left = mid + 1;
        } else if (mapping->addr > address) {
            right = mid;
        } else {
            return mid;
        }
    }

    return left;
}